

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

sxi32 jx9MemObjToInteger(jx9_value *pObj)

{
  uint uVar1;
  anon_union_8_3_18420de5_for_x aVar2;
  
  uVar1 = pObj->iFlags;
  if ((uVar1 & 2) != 0) {
    return 0;
  }
  if ((uVar1 & 4) == 0) {
    if ((uVar1 & 8) == 0) {
      if ((uVar1 & 1) == 0) {
        if ((uVar1 & 0x20) == 0) {
          if ((uVar1 & 0x40) != 0) {
            aVar2.iVal._4_4_ = 0;
            aVar2.iVal._0_4_ = ((jx9_hashmap *)(pObj->x).pOther)->nEntry;
            jx9HashmapUnref((jx9_hashmap *)(pObj->x).pOther);
            goto LAB_00118f7a;
          }
          if ((uVar1 >> 8 & 1) != 0) {
            aVar2.iVal._1_7_ = 0;
            aVar2.iVal._0_1_ = (pObj->x).iVal != 0;
            goto LAB_00118f7a;
          }
        }
        aVar2.rVal = 0.0;
      }
      else {
        aVar2.iVal = MemObjStringToInt(pObj);
      }
    }
    else {
      aVar2 = pObj->x;
    }
  }
  else {
    aVar2.rVal = -0.0;
    if (ABS((pObj->x).rVal) <= 9.223372036854776e+18) {
      aVar2.iVal = (long)(pObj->x).rVal;
    }
  }
LAB_00118f7a:
  (pObj->x).rVal = (jx9_real)aVar2;
  SyBlobRelease(&pObj->sBlob);
  pObj->iFlags = pObj->iFlags & 0xfffffe90U | 2;
  return 0;
}

Assistant:

JX9_PRIVATE sxi32 jx9MemObjToInteger(jx9_value *pObj)
{
	if( (pObj->iFlags & MEMOBJ_INT) == 0 ){
		/* Preform the conversion */
		pObj->x.iVal = MemObjIntValue(&(*pObj));
		/* Invalidate any prior representations */
		SyBlobRelease(&pObj->sBlob);
		MemObjSetType(pObj, MEMOBJ_INT);
	}
	return SXRET_OK;
}